

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_plus2(LispPTR tosm1,LispPTR tos)

{
  LispPTR *pLVar1;
  uint *NAddr;
  uint uVar2;
  LispPTR LVar3;
  LispPTR LVar4;
  
  if ((tos & 0xfff0000) == 0xf0000) {
    LVar3 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    LVar3 = tos & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
    goto LAB_001065e3;
    pLVar1 = NativeAligned4FromLAddr(tos);
    LVar3 = *pLVar1;
  }
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    LVar4 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    LVar4 = tosm1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tosm1 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
LAB_001065e3:
      LVar3 = N_OP_fplus2(tosm1,tos);
      return LVar3;
    }
    pLVar1 = NativeAligned4FromLAddr(tosm1);
    LVar4 = *pLVar1;
  }
  uVar2 = LVar3 + LVar4;
  if (SCARRY4(LVar3,LVar4)) {
    MachineState.errorexit = 1;
    LVar3 = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  else if ((uVar2 & 0xffff0000) == 0xffff0000) {
    LVar3 = uVar2 & 0xffff | 0xf0000;
  }
  else {
    if ((uVar2 & 0xffff0000) != 0) {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar2;
      LVar3 = LAddrFromNative(NAddr);
      return LVar3;
    }
    LVar3 = uVar2 | 0xe0000;
  }
  return LVar3;
}

Assistant:

LispPTR N_OP_plus2(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_GETNUMBER(tos, arg1, doufn);
  N_GETNUMBER(tosm1, arg2, doufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_sadd_overflow(arg1, arg2, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else
  /* UB: signed integer overflow: 2147483647 + 2147483647 cannot be represented in type 'int' */
  result = arg1 + arg2;
  if (((arg1 >= 0) == (arg2 >= 0)) && ((result >= 0) != (arg1 >= 0))) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif

doufn:
  return (N_OP_fplus2(tosm1, tos));
}